

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O1

_Bool trans_fsgnjn_s(DisasContext_conflict12 *ctx,arg_fsgnjn_s *a)

{
  TCGContext_conflict11 *s;
  _Bool _Var1;
  TCGTemp *ts;
  
  if (ctx->mstatus_fs != 0) {
    if ((ctx->misa & 0x20) == 0) {
      _Var1 = false;
    }
    else {
      s = ctx->uc->tcg_ctx;
      if (a->rs1 == a->rs2) {
        tcg_gen_xori_i64_riscv64(s,s->cpu_fpr[a->rd],s->cpu_fpr[a->rs1],-0x80000000);
      }
      else {
        ts = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
        tcg_gen_not_i64_riscv64(s,(TCGv_i64)((long)ts - (long)s),s->cpu_fpr[a->rs2]);
        tcg_gen_deposit_i64_riscv64
                  (s,s->cpu_fpr[a->rd],(TCGv_i64)((long)ts - (long)s),s->cpu_fpr[a->rs1],0,0x1f);
        tcg_temp_free_internal_riscv64(s,ts);
      }
      mark_fs_dirty(ctx);
      _Var1 = true;
    }
    return _Var1;
  }
  return false;
}

Assistant:

static bool trans_fsgnjn_s(DisasContext *ctx, arg_fsgnjn_s *a)
{
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    if (a->rs1 == a->rs2) { /* FNEG */
        tcg_gen_xori_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], tcg_ctx->cpu_fpr[a->rs1], INT32_MIN);
    } else {
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_not_i64(tcg_ctx, t0, tcg_ctx->cpu_fpr[a->rs2]);
        tcg_gen_deposit_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], t0, tcg_ctx->cpu_fpr[a->rs1], 0, 31);
        tcg_temp_free_i64(tcg_ctx, t0);
    }
    mark_fs_dirty(ctx);
    return true;
}